

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

ECalType icu_63::getCalendarTypeForLocale(char *locid)

{
  UBool UVar1;
  int32_t iVar2;
  UChar *us;
  UChar *uCalType;
  UResourceBundle *pUStack_170;
  int32_t len;
  UResourceBundle *order;
  UResourceBundle *rb;
  char region [4];
  int32_t calTypeBufLen;
  char calTypeBuf [32];
  char local_128 [4];
  int32_t canonicalLen;
  char canonicalName [256];
  ECalType local_20;
  UErrorCode local_1c;
  ECalType calType;
  UErrorCode status;
  char *locid_local;
  
  local_1c = U_ZERO_ERROR;
  local_20 = CALTYPE_UNKNOWN;
  _calType = locid;
  iVar2 = uloc_canonicalize_63(locid,local_128,0xff,&local_1c);
  UVar1 = ::U_FAILURE(local_1c);
  if (UVar1 == '\0') {
    local_128[iVar2] = '\0';
    rb._4_4_ = uloc_getKeywordValue_63(local_128,"calendar",region,0x1f,&local_1c);
    UVar1 = ::U_SUCCESS(local_1c);
    if (UVar1 != '\0') {
      region[rb._4_4_] = '\0';
      local_20 = getCalendarType(region);
      if (local_20 != CALTYPE_UNKNOWN) {
        return local_20;
      }
    }
    local_1c = U_ZERO_ERROR;
    ulocimp_getRegionForSupplementalData_63(local_128,'\x01',(char *)&rb,4,&local_1c);
    UVar1 = ::U_FAILURE(local_1c);
    if (UVar1 == '\0') {
      order = ures_openDirect_63((char *)0x0,"supplementalData",&local_1c);
      ures_getByKey_63(order,"calendarPreferenceData",order,&local_1c);
      pUStack_170 = ures_getByKey_63(order,(char *)&rb,(UResourceBundle *)0x0,&local_1c);
      if ((local_1c == U_MISSING_RESOURCE_ERROR) && (order != (UResourceBundle *)0x0)) {
        local_1c = U_ZERO_ERROR;
        pUStack_170 = ures_getByKey_63(order,"001",(UResourceBundle *)0x0,&local_1c);
      }
      region[0] = '\0';
      UVar1 = ::U_SUCCESS(local_1c);
      if ((UVar1 != '\0') && (pUStack_170 != (UResourceBundle *)0x0)) {
        uCalType._4_4_ = 0;
        us = ures_getStringByIndex_63(pUStack_170,0,(int32_t *)((long)&uCalType + 4),&local_1c);
        if (uCalType._4_4_ < 0x20) {
          u_UCharsToChars_63(us,region,uCalType._4_4_);
          region[uCalType._4_4_] = '\0';
          local_20 = getCalendarType(region);
        }
      }
      ures_close_63(pUStack_170);
      ures_close_63(order);
      if (local_20 == CALTYPE_UNKNOWN) {
        local_20 = CALTYPE_GREGORIAN;
      }
      locid_local._4_4_ = local_20;
    }
    else {
      locid_local._4_4_ = CALTYPE_GREGORIAN;
    }
  }
  else {
    locid_local._4_4_ = CALTYPE_GREGORIAN;
  }
  return locid_local._4_4_;
}

Assistant:

static ECalType getCalendarTypeForLocale(const char *locid) {
    UErrorCode status = U_ZERO_ERROR;
    ECalType calType = CALTYPE_UNKNOWN;

    //TODO: ULOC_FULL_NAME is out of date and too small..
    char canonicalName[256];

    // canonicalize, so grandfathered variant will be transformed to keywords
    // e.g ja_JP_TRADITIONAL -> ja_JP@calendar=japanese
    int32_t canonicalLen = uloc_canonicalize(locid, canonicalName, sizeof(canonicalName) - 1, &status);
    if (U_FAILURE(status)) {
        return CALTYPE_GREGORIAN;
    }
    canonicalName[canonicalLen] = 0;    // terminate

    char calTypeBuf[32];
    int32_t calTypeBufLen;

    calTypeBufLen = uloc_getKeywordValue(canonicalName, "calendar", calTypeBuf, sizeof(calTypeBuf) - 1, &status);
    if (U_SUCCESS(status)) {
        calTypeBuf[calTypeBufLen] = 0;
        calType = getCalendarType(calTypeBuf);
        if (calType != CALTYPE_UNKNOWN) {
            return calType;
        }
    }
    status = U_ZERO_ERROR;

    // when calendar keyword is not available or not supported, read supplementalData
    // to get the default calendar type for the locale's region
    char region[ULOC_COUNTRY_CAPACITY];
    (void)ulocimp_getRegionForSupplementalData(canonicalName, TRUE, region, sizeof(region), &status);
    if (U_FAILURE(status)) {
        return CALTYPE_GREGORIAN;
    }

    // Read preferred calendar values from supplementalData calendarPreference
    UResourceBundle *rb = ures_openDirect(NULL, "supplementalData", &status);
    ures_getByKey(rb, "calendarPreferenceData", rb, &status);
    UResourceBundle *order = ures_getByKey(rb, region, NULL, &status);
    if (status == U_MISSING_RESOURCE_ERROR && rb != NULL) {
        status = U_ZERO_ERROR;
        order = ures_getByKey(rb, "001", NULL, &status);
    }

    calTypeBuf[0] = 0;
    if (U_SUCCESS(status) && order != NULL) {
        // the first calender type is the default for the region
        int32_t len = 0;
        const UChar *uCalType = ures_getStringByIndex(order, 0, &len, &status);
        if (len < (int32_t)sizeof(calTypeBuf)) {
            u_UCharsToChars(uCalType, calTypeBuf, len);
            *(calTypeBuf + len) = 0; // terminate;
            calType = getCalendarType(calTypeBuf);
        }
    }

    ures_close(order);
    ures_close(rb);

    if (calType == CALTYPE_UNKNOWN) {
        // final fallback
        calType = CALTYPE_GREGORIAN;
    }
    return calType;
}